

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDebug.c
# Opt level: O2

void Abc_NtkAutoDebug(Abc_Ntk_t *pNtk,_func_int_Abc_Ntk_t_ptr *pFuncError)

{
  ulong uVar1;
  Abc_Obj_t *pObj_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  abctime aVar6;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar7;
  Abc_Ntk_t *pNtk_01;
  uint uVar8;
  int i;
  uint uVar9;
  int Counter;
  int iVar10;
  long lVar11;
  ulong uVar12;
  Abc_Obj_t *local_58;
  abctime local_50;
  abctime local_48;
  ulong local_40;
  Abc_Obj_t *pObj;
  
  aVar6 = Abc_Clock();
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDebug.c"
                  ,0x38,"void Abc_NtkAutoDebug(Abc_Ntk_t *, int (*)(Abc_Ntk_t *))");
  }
  srand(0x123123);
  pNtk_00 = Abc_NtkDup(pNtk);
  iVar2 = (*pFuncError)(pNtk_00);
  if (iVar2 == 0) {
    puts("The original network does not cause the bug. Quitting.");
  }
  else {
    uVar9 = 0;
    uVar8 = 1;
    local_50 = aVar6;
    do {
      local_48 = Abc_Clock();
      iVar10 = 0;
      for (iVar2 = 0; iVar2 < pNtk_00->vObjs->nSize; iVar2 = iVar2 + 1) {
        pAVar7 = Abc_NtkObj(pNtk_00,iVar2);
        if (pAVar7 != (Abc_Obj_t *)0x0) {
          for (lVar11 = 0; lVar11 < (pAVar7->vFanins).nSize; lVar11 = lVar11 + 1) {
            uVar3 = *(uint *)&pAVar7->field_0x14 & 0xf;
            if (uVar3 == 7) {
              iVar4 = Abc_NodeIsConst((Abc_Obj_t *)
                                      pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[lVar11]])
              ;
              if (iVar4 == 0) goto LAB_00276d56;
            }
            else if ((uVar3 == 3) && (pNtk_00->vPos->nSize != 1)) {
LAB_00276d56:
              iVar10 = iVar10 + 1;
            }
          }
        }
      }
      uVar3 = iVar10 * 2;
      uVar5 = rand();
      uVar8 = uVar8 ^ uVar5;
      uVar12 = 0;
      uVar5 = 0;
      if (0 < (int)uVar3) {
        uVar5 = uVar3;
      }
      for (; uVar5 != (uint)uVar12; uVar12 = (ulong)((int)uVar12 + 1)) {
        uVar1 = (long)(int)(uVar8 + (uint)uVar12) % (long)(int)uVar3;
        pNtk_01 = Abc_NtkDup(pNtk_00);
        if (pNtk_01->nObjCounts[7] != pNtk_00->nObjCounts[7]) {
          __assert_fail("Abc_NtkNodeNum(pNtk) == Abc_NtkNodeNum(pNtkInit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDebug.c"
                        ,0xba,"Abc_Ntk_t *Abc_NtkAutoDebugModify(Abc_Ntk_t *, int, int)");
        }
        local_40 = uVar12;
        Abc_NtkFindGivenFanin
                  (pNtk_01,(int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 |
                                       uVar1 & 0xffffffff) / 2),&pObj,&local_58);
        pAVar7 = pObj;
        if (((*(uint *)&pObj->field_0x14 & 0xf) == 3) &&
           (iVar2 = Abc_NodeIsConst(local_58), iVar2 != 0)) {
          Abc_NtkDeleteAll_rec(pAVar7);
        }
        else {
          if ((uVar1 & 1) == 0) {
            pAVar7 = Abc_NtkCreateNodeConst0(pNtk_01);
          }
          else {
            pAVar7 = Abc_NtkCreateNodeConst1(pNtk_01);
          }
          pObj_00 = local_58;
          Abc_ObjTransferFanout(local_58,pAVar7);
          Abc_NtkDeleteAll_rec(pObj_00);
          Abc_NtkSweep(pNtk_01,0);
          Abc_NtkCleanupSeq(pNtk_01,0,0,0);
          Abc_NtkToSop(pNtk_01,-1,1000000000);
          Abc_NtkCycleInitStateSop(pNtk_01,0x32,0);
        }
        Io_WriteBlifLogic(pNtk_00,"bug_temp.blif",1);
        iVar2 = (*pFuncError)(pNtk_01);
        uVar12 = local_40;
        if (iVar2 != 0) {
          Abc_NtkDelete(pNtk_00);
          pNtk_00 = pNtk_01;
          goto LAB_00276ed4;
        }
        Abc_NtkDelete(pNtk_01);
      }
      uVar12 = (ulong)uVar5;
LAB_00276ed4:
      iVar2 = 0x7ac225;
      printf("Iter %6d : Latches = %6d. Nodes = %6d. Steps = %6d. Error step = %3d.  ",(ulong)uVar9,
             (ulong)(uint)pNtk_00->nObjCounts[8],(ulong)(uint)pNtk_00->nObjCounts[7],(ulong)uVar3,
             uVar12 & 0xffffffff);
      Abc_Print(iVar2,"%s =","Time");
      aVar6 = Abc_Clock();
      Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar6 - local_48) / 1000000.0);
      uVar9 = uVar9 + 1;
    } while ((uint)uVar12 != uVar3);
    Io_WriteBlifLogic(pNtk_00,"bug_found.blif",1);
    iVar2 = 0x7ac26d;
    printf("Final network written into file \"%s\". ","bug_found.blif");
    Abc_Print(iVar2,"%s =","Total time");
    aVar6 = Abc_Clock();
    Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar6 - local_50) / 1000000.0);
  }
  Abc_NtkDelete(pNtk_00);
  return;
}

Assistant:

void Abc_NtkAutoDebug( Abc_Ntk_t * pNtk, int (*pFuncError) (Abc_Ntk_t *) )
{
    Abc_Ntk_t * pNtkMod;
    char * pFileName = "bug_found.blif";
    int i, nSteps, nIter, ModNum, RandNum = 1;
    abctime clk, clkTotal = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
    srand( 0x123123 );
    // create internal copy of the network
    pNtk = Abc_NtkDup(pNtk);
    if ( !(*pFuncError)( pNtk ) )
    {
        printf( "The original network does not cause the bug. Quitting.\n" );
        Abc_NtkDelete( pNtk );
        return;
    }
    // perform incremental modifications
    for ( nIter = 0; ; nIter++ )
    {
        clk = Abc_Clock();
        // count how many ways of modifying the network exists
        nSteps = 2 * Abc_NtkCountFaninsTotal(pNtk);
        // try modifying the network as many times
        RandNum ^= rand();
        for ( i = 0; i < nSteps; i++ )
        {
            // get the shifted number of bug
            ModNum = (i + RandNum) % nSteps;
            // get the modified network
            pNtkMod = Abc_NtkAutoDebugModify( pNtk, ModNum/2, ModNum%2 );
            // write the network
            Io_WriteBlifLogic( pNtk, "bug_temp.blif", 1 );   
            // check if the bug is still there
            if ( (*pFuncError)( pNtkMod ) ) // bug is still there
            {
                Abc_NtkDelete( pNtk );
                pNtk = pNtkMod;
                break;
            }
            else // no bug
                Abc_NtkDelete( pNtkMod );
        }
        printf( "Iter %6d : Latches = %6d. Nodes = %6d. Steps = %6d. Error step = %3d.  ", 
            nIter, Abc_NtkLatchNum(pNtk), Abc_NtkNodeNum(pNtk), nSteps, i );
        ABC_PRT( "Time", Abc_Clock() - clk );
        if ( i == nSteps ) // could not modify it while preserving the bug
            break;
    }
    // write out the final network
    Io_WriteBlifLogic( pNtk, pFileName, 1 );
    printf( "Final network written into file \"%s\". ", pFileName );
    ABC_PRT( "Total time", Abc_Clock() - clkTotal );
    Abc_NtkDelete( pNtk );
}